

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_CreateProperty(JSContext *ctx,JSObject *p,JSAtom prop,JSValue val,JSValue getter,
                     JSValue setter,int flags)

{
  int *piVar1;
  byte bVar2;
  ushort uVar3;
  JSClassExoticMethods *pJVar4;
  _func_int_JSContext_ptr_JSValue_JSAtom_JSValue_JSValue_JSValue_int *p_Var5;
  int64_t iVar6;
  int iVar7;
  BOOL BVar8;
  uint uVar9;
  int iVar10;
  JSValueUnion *pJVar11;
  int64_t iVar12;
  double dVar13;
  char *fmt;
  int64_t iVar14;
  JSValue *unaff_R15;
  JSValue JVar15;
  JSValue JVar16;
  int iStackY_90;
  uint32_t idx;
  JSValueUnion local_48;
  JSValueUnion local_40;
  uint32_t len;
  
  iStackY_90 = (int)unaff_R15;
  local_40 = (JSValueUnion)val.tag;
  local_48 = val.u;
  bVar2 = (p->field_0).header.dummy1;
  if ((bVar2 & 4) == 0) goto LAB_0010cc5e;
  uVar3 = (p->field_0).header.dummy2;
  if ((ulong)uVar3 == 2) {
    if ((bVar2 & 8) == 0) {
      BVar8 = JS_AtomIsArrayIndex(ctx,&idx,prop);
      if (BVar8 != 0) {
LAB_0010cf18:
        unaff_R15 = (JSValue *)p->prop;
        JVar16 = *unaff_R15;
        if (0xfffffff4 < (uint)unaff_R15->tag) {
          *(int *)(unaff_R15->u).ptr = *(unaff_R15->u).ptr + 1;
        }
        JS_ToInt32Free(ctx,(int32_t *)&len,JVar16);
        uVar9 = idx + 1;
        if (len < uVar9) {
          if ((p->shape[1].header.ref_count & 0x8000000) == 0) {
            uVar9 = JS_ThrowTypeErrorReadOnly(ctx,flags,0x30);
LAB_0010cef7:
            unaff_R15 = (JSValue *)(ulong)uVar9;
            goto LAB_0010cf0f;
          }
          iVar14 = 0;
          dVar13 = (double)uVar9;
          if (-1 < (int)uVar9) {
            dVar13 = (double)(ulong)uVar9;
          }
          iVar12 = 7;
          if (-1 < (int)uVar9) {
            iVar12 = iVar14;
          }
          piVar1 = (int *)(unaff_R15->u).ptr;
          iVar6 = unaff_R15->tag;
          JVar16 = *unaff_R15;
          (unaff_R15->u).float64 = dVar13;
          unaff_R15->tag = iVar12;
          len = uVar9;
          if ((0xfffffff4 < (uint)iVar6) && (iVar7 = *piVar1, *piVar1 = iVar7 + -1, iVar7 < 2)) {
            __JS_FreeValueRT(ctx->rt,JVar16);
            iVar14 = 0;
          }
          goto LAB_0010cfbd;
        }
      }
LAB_0010cfba:
      iVar14 = 0;
    }
    else if ((int)prop < 0) {
      idx = prop & 0x7fffffff;
      if (idx != (p->u).array.count) goto LAB_0010cefc;
      if ((bVar2 & 1) != 0) {
        if (((flags & 0x1800U) != 0) || ((~((uint)flags >> 8 & flags) & 7) != 0)) goto LAB_0010cefc;
        if (0xfffffff4 < (uint)val.tag) {
          *(int *)local_48.ptr = *local_48.ptr + 1;
        }
        uVar9 = add_fast_array_element(ctx,p,val,flags);
        goto LAB_0010cef7;
      }
      iVar14 = 2;
    }
    else {
      BVar8 = JS_AtomIsArrayIndex(ctx,&idx,prop);
      if (BVar8 == 0) goto LAB_0010cfba;
LAB_0010cefc:
      iVar7 = convert_fast_array_to_array(ctx,p);
      if (iVar7 == 0) goto LAB_0010cf18;
      unaff_R15 = (JSValue *)0xffffffffffffffff;
LAB_0010cf0f:
      iVar14 = 1;
    }
LAB_0010cfbd:
    if ((int)iVar14 == 0) goto LAB_0010cc5e;
    if ((int)iVar14 != 2) {
      return (int)unaff_R15;
    }
  }
  else {
    if ((ushort)(uVar3 - 0x15) < 9) {
      iVar7 = JS_AtomIsNumericIndex(ctx,prop);
      if (iVar7 != 0) {
        if (iVar7 < 0) {
          return -1;
        }
        fmt = "cannot create numeric index in typed array";
        goto LAB_0010cc6c;
      }
    }
    else if (((uint)flags >> 0x11 & 1) == 0) {
      pJVar4 = ctx->rt->class_array[uVar3].exotic;
      if (pJVar4 == (JSClassExoticMethods *)0x0) {
LAB_0010cff6:
        iVar7 = 0;
      }
      else {
        iVar7 = 1;
        p_Var5 = pJVar4->define_own_property;
        if (p_Var5 == (_func_int_JSContext_ptr_JSValue_JSAtom_JSValue_JSValue_JSValue_int *)0x0) {
          JVar16.tag = -1;
          JVar16.u.ptr = p;
          iVar10 = JS_IsExtensible(ctx,JVar16);
          if (iVar10 < 0) {
            iStackY_90 = -1;
          }
          else {
            if (iVar10 != 0) goto LAB_0010cff6;
            iVar7 = 2;
          }
        }
        else {
          JVar15.tag = -1;
          JVar15.u.ptr = p;
          iStackY_90 = (*p_Var5)(ctx,JVar15,prop,val,getter,setter,flags);
        }
      }
      if (iVar7 == 2) goto LAB_0010cc65;
      if (iVar7 != 0) {
        return iStackY_90;
      }
    }
LAB_0010cc5e:
    if (((p->field_0).header.dummy1 & 1) != 0) {
      uVar9 = flags & 7;
      if ((flags & 0x1800U) != 0) {
        uVar9 = flags & 5U | 0x10;
      }
      pJVar11 = (JSValueUnion *)add_property(ctx,p,prop,uVar9);
      if (pJVar11 == (JSValueUnion *)0x0) {
        return -1;
      }
      if ((flags & 0x1800U) == 0) {
        if (((uint)flags >> 0xd & 1) == 0) {
          pJVar11->int32 = 0;
          pJVar11[1].float64 = 1.48219693752374e-323;
        }
        else {
          if (0xfffffff4 < (uint)local_40.int32) {
            *(int *)local_48.ptr = *local_48.ptr + 1;
          }
          pJVar11->ptr = (void *)local_48;
          pJVar11[1] = local_40;
        }
        return 1;
      }
      pJVar11->float64 = 0.0;
      if ((((uint)flags >> 0xb & 1) != 0) && (iVar7 = JS_IsFunction(ctx,getter), iVar7 != 0)) {
        if (0xfffffff4 < (uint)getter.tag) {
          *(int *)getter.u.ptr = *getter.u.ptr + 1;
        }
        *pJVar11 = getter.u;
      }
      pJVar11[1].float64 = 0.0;
      if (((uint)flags >> 0xc & 1) != 0) {
        iVar7 = JS_IsFunction(ctx,setter);
        if (iVar7 != 0) {
          if (0xfffffff4 < (uint)setter.tag) {
            *(int *)setter.u.ptr = *setter.u.ptr + 1;
          }
          pJVar11[1] = setter.u;
          return 1;
        }
        return 1;
      }
      return 1;
    }
  }
LAB_0010cc65:
  fmt = "object is not extensible";
LAB_0010cc6c:
  iVar7 = JS_ThrowTypeErrorOrFalse(ctx,flags,fmt);
  return iVar7;
}

Assistant:

static int JS_CreateProperty(JSContext *ctx, JSObject *p,
                             JSAtom prop, JSValueConst val,
                             JSValueConst getter, JSValueConst setter,
                             int flags)
{
    JSProperty *pr;
    int ret, prop_flags;

    /* add a new property or modify an existing exotic one */
    if (p->is_exotic) {
        if (p->class_id == JS_CLASS_ARRAY) {
            uint32_t idx, len;

            if (p->fast_array) {
                if (__JS_AtomIsTaggedInt(prop)) {
                    idx = __JS_AtomToUInt32(prop);
                    if (idx == p->u.array.count) {
                        if (!p->extensible)
                            goto not_extensible;
                        if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET))
                            goto convert_to_array;
                        prop_flags = get_prop_flags(flags, 0);
                        if (prop_flags != JS_PROP_C_W_E)
                            goto convert_to_array;
                        return add_fast_array_element(ctx, p,
                                                      JS_DupValue(ctx, val), flags);
                    } else {
                        goto convert_to_array;
                    }
                } else if (JS_AtomIsArrayIndex(ctx, &idx, prop)) {
                    /* convert the fast array to normal array */
                convert_to_array:
                    if (convert_fast_array_to_array(ctx, p))
                        return -1;
                    goto generic_array;
                }
            } else if (JS_AtomIsArrayIndex(ctx, &idx, prop)) {
                JSProperty *plen;
                JSShapeProperty *pslen;
            generic_array:
                /* update the length field */
                plen = &p->prop[0];
                JS_ToUint32(ctx, &len, plen->u.value);
                if ((idx + 1) > len) {
                    pslen = get_shape_prop(p->shape);
                    if (unlikely(!(pslen->flags & JS_PROP_WRITABLE)))
                        return JS_ThrowTypeErrorReadOnly(ctx, flags, JS_ATOM_length);
                    /* XXX: should update the length after defining
                       the property */
                    len = idx + 1;
                    set_value(ctx, &plen->u.value, JS_NewUint32(ctx, len));
                }
            }
        } else if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
                   p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
            ret = JS_AtomIsNumericIndex(ctx, prop);
            if (ret != 0) {
                if (ret < 0)
                    return -1;
                return JS_ThrowTypeErrorOrFalse(ctx, flags, "cannot create numeric index in typed array");
            }
        } else if (!(flags & JS_PROP_NO_EXOTIC)) {
            const JSClassExoticMethods *em = ctx->rt->class_array[p->class_id].exotic;
            if (em) {
                if (em->define_own_property) {
                    return em->define_own_property(ctx, JS_MKPTR(JS_TAG_OBJECT, p),
                                                   prop, val, getter, setter, flags);
                }
                ret = JS_IsExtensible(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
                if (ret < 0)
                    return -1;
                if (!ret)
                    goto not_extensible;
            }
        }
    }

    if (!p->extensible) {
    not_extensible:
        return JS_ThrowTypeErrorOrFalse(ctx, flags, "object is not extensible");
    }

    if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
        prop_flags = (flags & (JS_PROP_CONFIGURABLE | JS_PROP_ENUMERABLE)) |
            JS_PROP_GETSET;
    } else {
        prop_flags = flags & JS_PROP_C_W_E;
    }
    pr = add_property(ctx, p, prop, prop_flags);
    if (unlikely(!pr))
        return -1;
    if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
        pr->u.getset.getter = NULL;
        if ((flags & JS_PROP_HAS_GET) && JS_IsFunction(ctx, getter)) {
            pr->u.getset.getter =
                JS_VALUE_GET_OBJ(JS_DupValue(ctx, getter));
        }
        pr->u.getset.setter = NULL;
        if ((flags & JS_PROP_HAS_SET) && JS_IsFunction(ctx, setter)) {
            pr->u.getset.setter =
                JS_VALUE_GET_OBJ(JS_DupValue(ctx, setter));
        }
    } else {
        if (flags & JS_PROP_HAS_VALUE) {
            pr->u.value = JS_DupValue(ctx, val);
        } else {
            pr->u.value = JS_UNDEFINED;
        }
    }
    return TRUE;
}